

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void __thiscall ieee754::set_infinity(ieee754 *this,int neg)

{
  int in_ESI;
  ieee754 *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  memset(in_RDI->buf,0,(long)in_RDI->bytes);
  set_exp((ieee754 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
  set_sign(in_RDI,in_ESI);
  return;
}

Assistant:

void set_infinity(int neg)
    {
        /* 
         *   Infinity is represented with the maximum exponent plus one, and
         *   the mantissa set to all zeros.  Infinities can be positive or
         *   negative, so set the sign bit.  
         */
        memset(buf, 0, bytes);
        set_exp(emax + 1);
        set_sign(neg);
    }